

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_pages.c
# Opt level: O0

HPDF_ExData HPDF_Page_Create3DAnnotExData(HPDF_Page page)

{
  HPDF_BOOL HVar1;
  HPDF_Annotation exData;
  HPDF_PageAttr attr;
  HPDF_Page page_local;
  
  HVar1 = HPDF_Page_Validate(page);
  if (HVar1 == 0) {
    page_local = (HPDF_Page)0x0;
  }
  else {
    page_local = HPDF_3DAnnotExData_New(page->mmgr,*(HPDF_Xref *)((long)page->attr + 0x78));
    if (page_local == (HPDF_ExData)0x0) {
      HPDF_CheckError(page->error);
    }
  }
  return page_local;
}

Assistant:

HPDF_EXPORT(HPDF_ExData)
HPDF_Page_Create3DAnnotExData(HPDF_Page page)
{
    HPDF_PageAttr attr;
    HPDF_Annotation exData;

    HPDF_PTRACE((" HPDF_Page_Create3DAnnotExData\n"));

    if (!HPDF_Page_Validate (page))
        return NULL;

    attr = (HPDF_PageAttr)page->attr;

    exData = HPDF_3DAnnotExData_New(page->mmgr, attr->xref);
    if ( !exData)
        HPDF_CheckError (page->error);

    return exData;
}